

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O2

void gutil::anon_unknown_4::printDescription(ostream *out,string *descr,size_t col,size_t n)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  
  uVar3 = 0;
  sVar8 = col;
  while (uVar6 = descr->_M_string_length, uVar3 < uVar6) {
    while ((uVar4 = uVar6, uVar6 != uVar3 &&
           (iVar1 = isspace((int)(descr->_M_dataplus)._M_p[uVar3]), uVar4 = uVar3, iVar1 != 0))) {
      uVar3 = uVar3 + 1;
    }
    uVar3 = uVar4;
    uVar4 = uVar3;
    uVar2 = uVar6;
    if (uVar6 < uVar3) {
      uVar2 = uVar3;
    }
    while ((uVar5 = uVar2, uVar4 < uVar6 &&
           (iVar1 = isspace((int)(descr->_M_dataplus)._M_p[uVar4]), uVar5 = uVar4, iVar1 == 0))) {
      uVar4 = uVar4 + 1;
    }
    if (col < sVar8 && n < (sVar8 - uVar3) + uVar5 + 1) {
      std::endl<char,std::char_traits<char>>(out);
      sVar7 = col;
      while (bVar9 = sVar7 != 0, sVar7 = sVar7 - 1, sVar8 = col, bVar9) {
        std::operator<<(out,' ');
      }
    }
    uVar6 = ~sVar8 + uVar3 + n;
    if ((uVar5 - uVar3) + sVar8 + 1 <= n) {
      uVar6 = uVar5;
    }
    if (sVar8 == 0) {
      sVar8 = 0;
    }
    else {
      sVar8 = sVar8 + 1;
      std::operator<<(out,' ');
    }
    for (; uVar3 < uVar6; uVar3 = uVar3 + 1) {
      std::operator<<(out,(descr->_M_dataplus)._M_p[uVar3]);
      sVar8 = sVar8 + 1;
    }
  }
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

void printDescription(std::ostream &out, std::string descr, size_t col, size_t n)
{
  size_t i=0;
  size_t c=col;

  while (i < descr.size())
  {
    while (i<descr.size() && isspace(descr[i]))
    {
      i++;
    }

    size_t k=i;

    while (k < descr.size() && !isspace(descr[k]))
    {
      k++;
    }

    if (c+1+k-i > n && c > col)
    {
      out << std::endl;

      for (c=0; c<col; c++)
      {
        out << ' ';
      }
    }

    if (c+1+k-i > n)
    {
      k=i+n-c-1;
    }

    if (c > 0)
    {
      out << ' ';
      c++;
    }

    while (i < k)
    {
      out << descr[i++];
      c++;
    }
  }

  out << std::endl;
}